

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGValidateDatatype
              (xmlRelaxNGValidCtxtPtr ctxt,xmlChar *value,xmlRelaxNGDefinePtr_conflict define,
              xmlNodePtr node)

{
  void *pvVar1;
  xmlRelaxNGDefinePtr_conflict define_00;
  xmlRelaxNGValidStatePtr pxVar2;
  xmlChar *pxVar3;
  int iVar4;
  xmlRelaxNGDefinePtr pxVar5;
  xmlChar *pxVar6;
  undefined8 uVar7;
  bool bVar8;
  void *result;
  
  iVar4 = -1;
  if ((define != (xmlRelaxNGDefinePtr_conflict)0x0) &&
     (pvVar1 = define->data, pvVar1 != (void *)0x0)) {
    if (*(code **)((long)pvVar1 + 0x18) == (code *)0x0) {
      iVar4 = -1;
    }
    else {
      if ((define->attrs == (xmlRelaxNGDefinePtr)0x0) || (define->attrs->type != XML_RELAXNG_PARAM))
      {
        uVar7 = *(undefined8 *)((long)pvVar1 + 8);
        pxVar6 = define->name;
      }
      else {
        uVar7 = *(undefined8 *)((long)pvVar1 + 8);
        pxVar6 = define->name;
      }
      iVar4 = (**(code **)((long)pvVar1 + 0x18))(uVar7,pxVar6,value);
    }
    if (iVar4 < 0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_TYPE,define->name,(xmlChar *)0x0,0);
      iVar4 = -1;
    }
    else {
      if (iVar4 == 1) {
        iVar4 = 0;
        bVar8 = true;
      }
      else if (iVar4 == 2) {
        bVar8 = false;
        xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_DUPID,value,(xmlChar *)0x0,1);
        iVar4 = 2;
      }
      else {
        xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_TYPEVAL,define->name,value,1);
        iVar4 = -1;
        bVar8 = false;
      }
      pxVar5 = define->attrs;
      if ((bool)(pxVar5 != (xmlRelaxNGDefinePtr)0x0 & bVar8)) {
        while (pxVar5->type == XML_RELAXNG_PARAM) {
          iVar4 = 0;
          if (*(code **)((long)pvVar1 + 0x28) != (code *)0x0) {
            iVar4 = (**(code **)((long)pvVar1 + 0x28))
                              (*(undefined8 *)((long)pvVar1 + 8),define->name,pxVar5->name,
                               pxVar5->value,value,0);
            iVar4 = -(uint)(iVar4 != 0);
          }
          bVar8 = iVar4 == 0;
          if ((!bVar8) || (pxVar5 = pxVar5->next, pxVar5 == (xmlRelaxNGDefinePtr)0x0)) break;
        }
      }
      if (bVar8) {
        define_00 = define->content;
        if (define_00 == (xmlRelaxNGDefinePtr_conflict)0x0) {
          iVar4 = 0;
        }
        else {
          pxVar2 = ctxt->state;
          pxVar6 = pxVar2->value;
          pxVar3 = pxVar2->endvalue;
          pxVar2->value = value;
          pxVar2->endvalue = (xmlChar *)0x0;
          iVar4 = xmlRelaxNGValidateValue(ctxt,define_00);
          pxVar2 = ctxt->state;
          pxVar2->value = pxVar6;
          pxVar2->endvalue = pxVar3;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int
xmlRelaxNGValidateDatatype(xmlRelaxNGValidCtxtPtr ctxt,
                           const xmlChar * value,
                           xmlRelaxNGDefinePtr define, xmlNodePtr node)
{
    int ret, tmp;
    xmlRelaxNGTypeLibraryPtr lib;
    void *result = NULL;
    xmlRelaxNGDefinePtr cur;

    if ((define == NULL) || (define->data == NULL)) {
        return (-1);
    }
    lib = (xmlRelaxNGTypeLibraryPtr) define->data;
    if (lib->check != NULL) {
        if ((define->attrs != NULL) &&
            (define->attrs->type == XML_RELAXNG_PARAM)) {
            ret =
                lib->check(lib->data, define->name, value, &result, node);
        } else {
            ret = lib->check(lib->data, define->name, value, NULL, node);
        }
    } else
        ret = -1;
    if (ret < 0) {
        VALID_ERR2(XML_RELAXNG_ERR_TYPE, define->name);
        if ((result != NULL) && (lib != NULL) && (lib->freef != NULL))
            lib->freef(lib->data, result);
        return (-1);
    } else if (ret == 1) {
        ret = 0;
    } else if (ret == 2) {
        VALID_ERR2P(XML_RELAXNG_ERR_DUPID, value);
    } else {
        VALID_ERR3P(XML_RELAXNG_ERR_TYPEVAL, define->name, value);
        ret = -1;
    }
    cur = define->attrs;
    while ((ret == 0) && (cur != NULL) && (cur->type == XML_RELAXNG_PARAM)) {
        if (lib->facet != NULL) {
            tmp = lib->facet(lib->data, define->name, cur->name,
                             cur->value, value, result);
            if (tmp != 0)
                ret = -1;
        }
        cur = cur->next;
    }
    if ((ret == 0) && (define->content != NULL)) {
        const xmlChar *oldvalue, *oldendvalue;

        oldvalue = ctxt->state->value;
        oldendvalue = ctxt->state->endvalue;
        ctxt->state->value = (xmlChar *) value;
        ctxt->state->endvalue = NULL;
        ret = xmlRelaxNGValidateValue(ctxt, define->content);
        ctxt->state->value = (xmlChar *) oldvalue;
        ctxt->state->endvalue = (xmlChar *) oldendvalue;
    }
    if ((result != NULL) && (lib != NULL) && (lib->freef != NULL))
        lib->freef(lib->data, result);
    return (ret);
}